

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GcodePovray.cpp
# Opt level: O1

double __thiscall vector3::GetZAngle(vector3 *this)

{
  double dVar1;
  double dVar2;
  
  dVar1 = this->x;
  if ((dVar1 != 0.0) || (NAN(dVar1))) {
    dVar2 = atan(this->y / dVar1);
    dVar2 = (dVar2 * 180.0) / 3.141592653589793;
  }
  else {
    dVar2 = *(double *)(&DAT_001090a0 + (ulong)(0.0 < this->y) * 8);
  }
  return (double)(~-(ulong)(dVar1 < 0.0) & (ulong)dVar2 |
                 (ulong)(dVar2 + 180.0) & -(ulong)(dVar1 < 0.0));
}

Assistant:

double GetZAngle()
  {
    return GetRotateAngle(x, y);
  }